

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void __thiscall
TestLexer_TestNextToken_Test::~TestLexer_TestNextToken_Test(TestLexer_TestNextToken_Test *this)

{
  TestLexer_TestNextToken_Test *this_local;
  
  ~TestLexer_TestNextToken_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestLexer, TestNextToken){
    keywords.emplace_back(Word(TokenType::DECLARE, "declare"));
    keywords.emplace_back(Word(TokenType::ID, "x"));
    keywords.emplace_back(Symbol(TokenType::NEWLINE, "\n"));
    keywords.emplace_back(Word(TokenType::DECLARE, "declare"));
    keywords.emplace_back(Word(TokenType::ID, "y"));

    Lexer * testLexer = Lexer::New(R"(declare x
                                   declare y)");

    for(auto& kw : keywords){
        auto l = testLexer->NextToken();
        cout << l.Literal << endl;
        EXPECT_EQ(kw.Type, l.Type);
        EXPECT_EQ(kw.Literal, l.Literal);
    }
}